

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsObjectDefinePropertyFull
          (JsValueRef object,JsValueRef key,JsValueRef value,JsValueRef getter,JsValueRef setter,
          bool writable,bool enumerable,bool configurable,bool *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode exitStatus;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  undefined7 in_register_00000089;
  void *unaff_retaddr;
  undefined1 auStack_f8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 auStack_b8 [8];
  TTDRecorder _actionEntryPopper;
  EnterScriptObject __enterScriptObject;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  JsValueRef local_40;
  undefined4 local_38;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_b8 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  propertyRecord = (PropertyRecord *)setter;
  local_40 = getter;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_003691fd;
  }
  local_38 = (undefined4)CONCAT71(in_register_00000089,writable);
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&_actionEntryPopper.m_resultPtr,scriptContext,
             (ScriptEntryExitRecord *)auStack_f8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x790,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_00369506;
    *puVar6 = 0;
  }
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x791,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar3) {
LAB_00369506:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  exitStatus = JsErrorInvalidArgument;
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003691e8;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      }
      exitStatus = JsErrorInvalidArgument;
      if ((ulong)key >> 0x30 == 0 && key != (JsValueRef)0x0) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(key);
        pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        if (pSVar1 != scriptContext) {
          exitStatus = JsErrorWrongRuntime;
          if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003691e8;
          key = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
        }
        if (result == (bool *)0x0) {
          exitStatus = JsErrorNullArgument;
        }
        else {
          *result = false;
          local_50 = (PropertyRecord *)0x0;
          pRVar7 = Js::VarTo<Js::RecyclableObject>(key);
          exitStatus = InternalGetPropertyRecord(scriptContext,pRVar7,&local_50);
          if (exitStatus == JsNoError) {
            Js::PropertyDescriptor::PropertyDescriptor
                      ((PropertyDescriptor *)&__enterScriptObject.library);
            if (value != (JsValueRef)0x0) {
              Js::PropertyDescriptor::SetValue
                        ((PropertyDescriptor *)&__enterScriptObject.library,value);
            }
            if (local_40 != (Var)0x0) {
              Js::PropertyDescriptor::SetGetter
                        ((PropertyDescriptor *)&__enterScriptObject.library,local_40);
            }
            if (propertyRecord != (PropertyRecord *)0x0) {
              Js::PropertyDescriptor::SetSetter
                        ((PropertyDescriptor *)&__enterScriptObject.library,propertyRecord);
            }
            if ((char)local_38 != '\0') {
              Js::PropertyDescriptor::SetWritable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            if (enumerable) {
              Js::PropertyDescriptor::SetEnumerable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            if (configurable) {
              Js::PropertyDescriptor::SetConfigurable
                        ((PropertyDescriptor *)&__enterScriptObject.library,true);
            }
            pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
            exitStatus = JsNoError;
            BVar4 = Js::JavascriptOperators::DefineOwnPropertyDescriptor
                              (pRVar7,local_50->pid,
                               (PropertyDescriptor *)&__enterScriptObject.library,true,scriptContext
                               ,PropertyOperation_None);
            *result = BVar4 != 0;
          }
        }
      }
    }
  }
LAB_003691e8:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
LAB_003691fd:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_b8,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API
JsObjectDefinePropertyFull(
    _In_ JsValueRef object,
    _In_ JsValueRef key,
    _In_opt_ JsValueRef value,
    _In_opt_ JsValueRef getter,
    _In_opt_ JsValueRef setter,
    _In_ bool writable,
    _In_ bool enumerable,
    _In_ bool configurable,
    _Out_ bool *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(key, scriptContext);
        PARAM_NOT_NULL(result);
        *result = false;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(key), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Js::PropertyDescriptor propertyDescriptor;
        if (value)
        {
            propertyDescriptor.SetValue(value);
        }
        if (getter)
        {
            propertyDescriptor.SetGetter(getter);
        }
        if (setter)
        {
            propertyDescriptor.SetSetter(setter);
        }
        if (writable)
        {
            propertyDescriptor.SetWritable(writable);
        }
        if (enumerable)
        {
            propertyDescriptor.SetEnumerable(enumerable);
        }
        if (configurable)
        {
            propertyDescriptor.SetConfigurable(configurable);
        }

        *result = Js::JavascriptOperators::DefineOwnPropertyDescriptor(
            Js::VarTo<Js::RecyclableObject>(object), propertyRecord->GetPropertyId(),
            propertyDescriptor, true, scriptContext) != 0;
        return JsNoError;
    });
}